

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_manager.cpp
# Opt level: O0

void __thiscall
pcplusplus::thread_manager::run_threads
          (thread_manager *this,size_t num_producers,size_t num_consumers,size_t buffer_capacity,
          size_t target)

{
  bool bVar1;
  void *pvVar2;
  long *plVar3;
  long *plVar4;
  ulong uVar5;
  ulong uVar6;
  ostream *poVar7;
  long in_RDI;
  thread_failure *e_3;
  size_t num_consumed;
  size_t num_produced;
  bad_alloc *e_2;
  bad_alloc *e_1;
  generic_threads *consumers;
  generic_threads *producers;
  condition_variable canConsume;
  condition_variable canProduce;
  mutex mtx;
  bad_alloc *e;
  queue<long> *buffer;
  queue<long> *in_stack_fffffffffffffe40;
  size_t in_stack_fffffffffffffe58;
  queue<long> *in_stack_fffffffffffffe60;
  C_V *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  mutex *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  size_t in_stack_fffffffffffffea8;
  consumer_threads *in_stack_fffffffffffffeb0;
  queue<long> *in_stack_fffffffffffffec0;
  condition_variable local_d0 [48];
  condition_variable local_a0 [112];
  void *local_30;
  
  pvVar2 = operator_new(0x28);
  queue<long>::queue(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  local_30 = pvVar2;
  std::mutex::mutex((mutex *)0x1071fe);
  std::condition_variable::condition_variable(local_a0);
  std::condition_variable::condition_variable(local_d0);
  plVar3 = (long *)operator_new(0x288);
  threads::producer_threads::producer_threads
            ((producer_threads *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),in_stack_fffffffffffffe98
             ,(C_V *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
             in_stack_fffffffffffffe88,in_stack_fffffffffffffec0);
  plVar4 = (long *)operator_new(0x288);
  threads::consumer_threads::consumer_threads
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),in_stack_fffffffffffffe98
             ,(C_V *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
             in_stack_fffffffffffffe88,in_stack_fffffffffffffec0);
  (**(code **)(*plVar3 + 0x18))();
  (**(code **)(*plVar4 + 0x18))();
  uVar5 = (**(code **)(*plVar3 + 0x20))();
  uVar6 = (**(code **)(*plVar4 + 0x20))();
  bVar1 = threads::generic_threads::logfile_is_open((generic_threads *)0x1075a1);
  *(bool *)in_RDI = bVar1;
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 0x10))();
  }
  bVar1 = threads::generic_threads::logfile_is_open((generic_threads *)0x1075e3);
  *(bool *)(in_RDI + 1) = bVar1;
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 0x10))();
  }
  pvVar2 = local_30;
  if (local_30 != (void *)0x0) {
    queue<long>::~queue(in_stack_fffffffffffffe40);
    operator_delete(pvVar2,0x28);
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"All threads finished.");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<((ostream *)&std::cout,"Produced: ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar5);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<(poVar7,"Consumed: ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar6);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  std::condition_variable::~condition_variable(local_d0);
  std::condition_variable::~condition_variable(local_a0);
  return;
}

Assistant:

void thread_manager::run_threads(std::size_t num_producers, std::size_t num_consumers, std::size_t buffer_capacity, std::size_t target){
	queue<long> *buffer;
	try{
            buffer = new queue<long>(buffer_capacity);
        }
        catch(const std::bad_alloc& e){
	    std::cerr << "Failed to initialize buffer" << std::endl;
	    std::exit(EXIT_FAILURE);
        }
	std::mutex mtx;
	std::condition_variable canProduce, canConsume;
	threads::generic_threads *producers, *consumers;
	try{
	    producers = new threads::producer_threads(target, num_producers, &mtx, &canProduce, &canConsume, buffer);
	}
	catch(const std::bad_alloc& e){
	    std::cerr << "Failed to allocate memory for producer threads." << std::endl;
	    std::exit(EXIT_FAILURE);
	}

	try{
	    consumers = new threads::consumer_threads(target, num_consumers, &mtx, &canConsume, &canProduce, buffer);
	}
	catch(const std::bad_alloc& e){
	    std::cerr << "Failed to allocate memory for consumer threads." << std::endl;
	    std::exit(EXIT_FAILURE);
	}
	
	size_t num_produced, num_consumed;
	try{
	    producers->fork();
	    consumers->fork();
	    num_produced = producers->join();
	    num_consumed = consumers->join();
	}
	catch(const exceptions::thread_failure& e){
	    std::cerr << e.what() << std::endl;
	    std::exit(EXIT_FAILURE);
	}
	
	last_producer_log_status = producers->logfile_is_open();
	delete producers;

	last_consumer_log_status = consumers->logfile_is_open();
	delete consumers;

	delete buffer;

	std::cout << "All threads finished." << std::endl;
	std::cout << "Produced: " << num_produced << std::endl << "Consumed: " << num_consumed << std::endl << std::endl;
    }